

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  ostream *poVar2;
  KinDynComputations model;
  parser *in_stack_000000a8;
  KinDynComputations *in_stack_000000b0;
  bool ok;
  ModelLoader loader;
  string modelPath;
  parser cmd;
  parser *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  parser *this;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  KinDynComputations local_188 [16];
  parser *cmd_00;
  KinDynComputations *comp;
  parser *cmd_01;
  _Base_ptr in_stack_fffffffffffffea0;
  allocator<char> local_151;
  vector local_150 [24];
  string *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  ModelLoader local_128 [8];
  undefined8 in_stack_fffffffffffffee0;
  string local_118 [4];
  undefined4 in_stack_fffffffffffffeec;
  parser *in_stack_fffffffffffffef0;
  string local_f8 [244];
  int local_4;
  
  local_4 = 0;
  cmdline::parser::parser(in_stack_fffffffffffffe20);
  addOptions((parser *)
             cmd.errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmdline::parser::parse_check
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(char **)in_stack_fffffffffffffee0)
  ;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffee7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  __s = cmdline::parser::get<std::__cxx11::string>
                  ((parser *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
  std::__cxx11::string::string(local_f8,(string *)__s);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  iDynTree::ModelLoader::ModelLoader(local_128);
  __a = &local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  cmd_00 = (parser *)0x0;
  comp = (KinDynComputations *)0x0;
  cmd_01 = (parser *)0x0;
  this = (parser *)&stack0xfffffffffffffe88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1092f3);
  bVar1 = iDynTree::ModelLoader::loadModelFromFile((string *)local_128,local_f8,local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  std::__cxx11::string::~string((string *)local_150);
  std::allocator<char>::~allocator(&local_151);
  bVar1 = bVar1 & 1;
  iDynTree::KinDynComputations::KinDynComputations(local_188);
  if ((bVar1 & 1) != 0) {
    iDynTree::ModelLoader::model();
    bVar1 = iDynTree::KinDynComputations::loadRobotModel((Model *)local_188);
    if ((bVar1 & 1) != 0) {
      handlePrintOption((KinDynComputations *)in_stack_fffffffffffffea0,cmd_01);
      handleTotalMassOptions(comp,cmd_00);
      handleLinkCOMOptions(in_stack_000000b0,in_stack_000000a8);
      handleFramePoseOptions
                ((KinDynComputations *)
                 cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                 (parser *)cmd.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      local_4 = 0;
      goto LAB_00109564;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Impossible to read model at file ");
  poVar2 = std::operator<<(poVar2,local_f8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_4 = 1;
LAB_00109564:
  iDynTree::KinDynComputations::~KinDynComputations(local_188);
  iDynTree::ModelLoader::~ModelLoader(local_128);
  std::__cxx11::string::~string(local_f8);
  cmdline::parser::~parser(this);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    cmdline::parser cmd;
    addOptions(cmd);
    cmd.parse_check(argc, argv);

    // Read model
    std::string modelPath = cmd.get<std::string>("model");
    iDynTree::ModelLoader loader;
    bool ok = loader.loadModelFromFile(modelPath);
    iDynTree::KinDynComputations model;
    if( !ok || !model.loadRobotModel(loader.model()))
    {
        std::cerr << "Impossible to read model at file " << modelPath << std::endl;
        return EXIT_FAILURE;
    }

    // Handle print option
    handlePrintOption(model,cmd);

    // Handle total mass option
    handleTotalMassOptions(model,cmd);

    // Handle link com
    handleLinkCOMOptions(model,cmd);

    // Handle frame pose
    handleFramePoseOptions(model,cmd);


    return EXIT_SUCCESS;
}